

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

ssize_t __thiscall Parsing::File::write(File *this,int __fd,void *__buf,size_t __n)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  undefined8 unaff_RBX;
  undefined4 in_register_00000034;
  string *s;
  string *psVar4;
  bool bVar5;
  ofstream f;
  
  bVar2 = isFile(this);
  bVar5 = (this->_path)._M_string_length != 0;
  if (bVar5 && bVar2) {
    std::ofstream::ofstream(&f,(string *)&this->_path,_S_out);
    psVar1 = (string *)((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
    for (psVar4 = *(string **)CONCAT44(in_register_00000034,__fd); psVar4 != psVar1;
        psVar4 = psVar4 + 0x20) {
      poVar3 = std::operator<<((ostream *)&f,psVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::ofstream::close();
    std::ofstream::~ofstream(&f);
  }
  return CONCAT71((int7)((ulong)unaff_RBX >> 8),bVar5 && bVar2) & 0xffffffff;
}

Assistant:

bool File::write(const std::vector<std::string> &in) const noexcept
    {
        if (!isFile() || _path.empty())
            return false;

        std::ofstream f(_path);

        for (const std::string &s : in)
            f << s << std::endl;
        f.close();

        return true;
    }